

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_utils.hpp
# Opt level: O0

void duckdb::ThrowNumericCastError<char,unsigned_int>(uint in,char minval,char maxval)

{
  undefined8 uVar1;
  allocator local_29;
  string local_28 [10];
  char in_stack_ffffffffffffffe2;
  char in_stack_ffffffffffffffe3;
  uint in_stack_ffffffffffffffe4;
  string *in_stack_ffffffffffffffe8;
  InternalException *in_stack_fffffffffffffff0;
  
  uVar1 = __cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_28,"Information loss on integer cast: value %d outside of target range [%d, %d]",
             &local_29);
  InternalException::InternalException<unsigned_int,char,char>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
             in_stack_ffffffffffffffe3,in_stack_ffffffffffffffe2);
  __cxa_throw(uVar1,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

static void ThrowNumericCastError(FROM in, TO minval, TO maxval) {
	throw InternalException("Information loss on integer cast: value %d outside of target range [%d, %d]", in, minval,
	                        maxval);
}